

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbopacking32.h
# Opt level: O0

void unpackforblock24(uint32_t base,uint8_t **pw,uint32_t **pout)

{
  uint8_t *puVar1;
  uint32_t *puVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  undefined8 uVar12;
  long lVar13;
  long lVar14;
  uint64_t w11;
  uint64_t w10;
  uint64_t w9;
  uint64_t w8;
  uint64_t w7;
  uint64_t w6;
  uint64_t w5;
  uint64_t w4;
  uint64_t w3;
  uint64_t w2;
  uint64_t w1;
  uint64_t w0;
  uint64_t mask;
  uint32_t *out;
  uint64_t *pw64;
  uint32_t **pout_local;
  
  puVar1 = *pw;
  puVar2 = *pout;
  uVar3 = *(undefined8 *)puVar1;
  lVar4 = *(long *)(puVar1 + 8);
  lVar5 = *(long *)(puVar1 + 0x10);
  uVar6 = *(undefined8 *)(puVar1 + 0x18);
  lVar7 = *(long *)(puVar1 + 0x20);
  lVar8 = *(long *)(puVar1 + 0x28);
  uVar9 = *(undefined8 *)(puVar1 + 0x30);
  lVar10 = *(long *)(puVar1 + 0x38);
  lVar11 = *(long *)(puVar1 + 0x40);
  uVar12 = *(undefined8 *)(puVar1 + 0x48);
  lVar13 = *(long *)(puVar1 + 0x50);
  lVar14 = *(long *)(puVar1 + 0x58);
  *pw = *pw + 0x60;
  *puVar2 = base + ((uint)uVar3 & 0xffffff);
  puVar2[1] = base + ((uint)((ulong)uVar3 >> 0x18) & 0xffffff);
  puVar2[2] = base + ((uint)(ushort)((ulong)uVar3 >> 0x30) | (uint)(lVar4 << 0x10) & 0xffffff);
  puVar2[3] = base + ((uint)((ulong)lVar4 >> 8) & 0xffffff);
  puVar2[4] = base + ((uint)((ulong)lVar4 >> 0x20) & 0xffffff);
  puVar2[5] = base + ((uint)(byte)((ulong)lVar4 >> 0x38) | (uint)(lVar5 << 8) & 0xffffff);
  puVar2[6] = base + ((uint)((ulong)lVar5 >> 0x10) & 0xffffff);
  puVar2[7] = base + (uint)((ulong)lVar5 >> 0x28);
  puVar2[8] = base + ((uint)uVar6 & 0xffffff);
  puVar2[9] = base + ((uint)((ulong)uVar6 >> 0x18) & 0xffffff);
  puVar2[10] = base + ((uint)(ushort)((ulong)uVar6 >> 0x30) | (uint)(lVar7 << 0x10) & 0xffffff);
  puVar2[0xb] = base + ((uint)((ulong)lVar7 >> 8) & 0xffffff);
  puVar2[0xc] = base + ((uint)((ulong)lVar7 >> 0x20) & 0xffffff);
  puVar2[0xd] = base + ((uint)(byte)((ulong)lVar7 >> 0x38) | (uint)(lVar8 << 8) & 0xffffff);
  puVar2[0xe] = base + ((uint)((ulong)lVar8 >> 0x10) & 0xffffff);
  puVar2[0xf] = base + (uint)((ulong)lVar8 >> 0x28);
  puVar2[0x10] = base + ((uint)uVar9 & 0xffffff);
  puVar2[0x11] = base + ((uint)((ulong)uVar9 >> 0x18) & 0xffffff);
  puVar2[0x12] = base + ((uint)(ushort)((ulong)uVar9 >> 0x30) | (uint)(lVar10 << 0x10) & 0xffffff);
  puVar2[0x13] = base + ((uint)((ulong)lVar10 >> 8) & 0xffffff);
  puVar2[0x14] = base + ((uint)((ulong)lVar10 >> 0x20) & 0xffffff);
  puVar2[0x15] = base + ((uint)(byte)((ulong)lVar10 >> 0x38) | (uint)(lVar11 << 8) & 0xffffff);
  puVar2[0x16] = base + ((uint)((ulong)lVar11 >> 0x10) & 0xffffff);
  puVar2[0x17] = base + (uint)((ulong)lVar11 >> 0x28);
  puVar2[0x18] = base + ((uint)uVar12 & 0xffffff);
  puVar2[0x19] = base + ((uint)((ulong)uVar12 >> 0x18) & 0xffffff);
  puVar2[0x1a] = base + ((uint)(ushort)((ulong)uVar12 >> 0x30) | (uint)(lVar13 << 0x10) & 0xffffff);
  puVar2[0x1b] = base + ((uint)((ulong)lVar13 >> 8) & 0xffffff);
  puVar2[0x1c] = base + ((uint)((ulong)lVar13 >> 0x20) & 0xffffff);
  puVar2[0x1d] = base + ((uint)(byte)((ulong)lVar13 >> 0x38) | (uint)(lVar14 << 8) & 0xffffff);
  puVar2[0x1e] = base + ((uint)((ulong)lVar14 >> 0x10) & 0xffffff);
  puVar2[0x1f] = base + (uint)((ulong)lVar14 >> 0x28);
  *pout = *pout + 0x20;
  return;
}

Assistant:

static void unpackforblock24(const uint32_t base, const uint8_t **pw,
                             uint32_t **pout) {
  const uint64_t *pw64 = *(const uint64_t **)pw;
  uint32_t *out = *pout;
  const uint64_t mask = UINT64_C(16777215);
  /* we are going to access  12 64-bit words */
  uint64_t w0 = pw64[0];
  uint64_t w1 = pw64[1];
  uint64_t w2 = pw64[2];
  uint64_t w3 = pw64[3];
  uint64_t w4 = pw64[4];
  uint64_t w5 = pw64[5];
  uint64_t w6 = pw64[6];
  uint64_t w7 = pw64[7];
  uint64_t w8 = pw64[8];
  uint64_t w9 = pw64[9];
  uint64_t w10 = pw64[10];
  uint64_t w11 = pw64[11];
  *pw += 96; /* we used up 96 input bytes */
  out[0] = base + (uint32_t)((w0)&mask);
  out[1] = base + (uint32_t)((w0 >> 24) & mask);
  out[2] = base + (uint32_t)(((w0 >> 48) | (w1 << 16)) & mask);
  out[3] = base + (uint32_t)((w1 >> 8) & mask);
  out[4] = base + (uint32_t)((w1 >> 32) & mask);
  out[5] = base + (uint32_t)(((w1 >> 56) | (w2 << 8)) & mask);
  out[6] = base + (uint32_t)((w2 >> 16) & mask);
  out[7] = base + (uint32_t)(w2 >> 40);
  out[8] = base + (uint32_t)((w3)&mask);
  out[9] = base + (uint32_t)((w3 >> 24) & mask);
  out[10] = base + (uint32_t)(((w3 >> 48) | (w4 << 16)) & mask);
  out[11] = base + (uint32_t)((w4 >> 8) & mask);
  out[12] = base + (uint32_t)((w4 >> 32) & mask);
  out[13] = base + (uint32_t)(((w4 >> 56) | (w5 << 8)) & mask);
  out[14] = base + (uint32_t)((w5 >> 16) & mask);
  out[15] = base + (uint32_t)(w5 >> 40);
  out[16] = base + (uint32_t)((w6)&mask);
  out[17] = base + (uint32_t)((w6 >> 24) & mask);
  out[18] = base + (uint32_t)(((w6 >> 48) | (w7 << 16)) & mask);
  out[19] = base + (uint32_t)((w7 >> 8) & mask);
  out[20] = base + (uint32_t)((w7 >> 32) & mask);
  out[21] = base + (uint32_t)(((w7 >> 56) | (w8 << 8)) & mask);
  out[22] = base + (uint32_t)((w8 >> 16) & mask);
  out[23] = base + (uint32_t)(w8 >> 40);
  out[24] = base + (uint32_t)((w9)&mask);
  out[25] = base + (uint32_t)((w9 >> 24) & mask);
  out[26] = base + (uint32_t)(((w9 >> 48) | (w10 << 16)) & mask);
  out[27] = base + (uint32_t)((w10 >> 8) & mask);
  out[28] = base + (uint32_t)((w10 >> 32) & mask);
  out[29] = base + (uint32_t)(((w10 >> 56) | (w11 << 8)) & mask);
  out[30] = base + (uint32_t)((w11 >> 16) & mask);
  out[31] = base + (uint32_t)(w11 >> 40);
  *pout += 32; /* we wrote 32 32-bit integers */
}